

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerWeakReference.h
# Opt level: O0

void __thiscall
Memory::WeakReferenceHashTable<PrimePolicy>::WeakReferenceHashTable
          (WeakReferenceHashTable<PrimePolicy> *this,uint size,HeapAllocator *allocator)

{
  HeapAllocator *this_00;
  uint uVar1;
  Memory *this_01;
  RecyclerWeakReferenceBase **ppRVar2;
  TrackAllocData local_48;
  HeapAllocator *local_20;
  HeapAllocator *allocator_local;
  WeakReferenceHashTable<PrimePolicy> *pWStack_10;
  uint size_local;
  WeakReferenceHashTable<PrimePolicy> *this_local;
  
  this->allocator = allocator;
  this->count = 0;
  this->size = 0;
  this->freeList = (RecyclerWeakReferenceBase *)0x0;
  this->modFunctionIndex = 0x4b;
  local_20 = allocator;
  allocator_local._4_4_ = size;
  pWStack_10 = this;
  uVar1 = PrimePolicy::GetSize(size,&this->modFunctionIndex);
  this_00 = local_20;
  this->size = uVar1;
  TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&RecyclerWeakReferenceBase*::typeinfo,0,(ulong)this->size,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerWeakReference.h"
             ,0x7f);
  this_01 = (Memory *)HeapAllocator::TrackAllocInfo(this_00,&local_48);
  ppRVar2 = AllocateArray<Memory::HeapAllocator,Memory::RecyclerWeakReferenceBase*,false>
                      (this_01,(HeapAllocator *)HeapAllocator::AllocZero,0,(ulong)this->size);
  this->buckets = ppRVar2;
  return;
}

Assistant:

WeakReferenceHashTable(uint size, HeapAllocator* allocator):
        count(0),
        size(0),
        modFunctionIndex(UNKNOWN_MOD_INDEX),
        allocator(allocator),
        freeList(nullptr)
    {
        this->size = SizePolicy::GetSize(size, &modFunctionIndex);
        buckets = AllocatorNewArrayZ(HeapAllocator, allocator, RecyclerWeakReferenceBase*, this->size);
    }